

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deStringUtil.hpp
# Opt level: O1

string * __thiscall
de::toString<tcu::Format::Hex<4ul>>(string *__return_storage_ptr__,de *this,Hex<4UL> *value)

{
  ostringstream s;
  Hex<4UL> local_198;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  local_198.value = *(deUint64 *)this;
  tcu::Format::Hex<4UL>::toStream(&local_198,(ostream *)local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString (const T& value)
{
	std::ostringstream s;
	s << value;
	return s.str();
}